

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::TessCoordComponent::compareOneMinusTessCoord
               (TestLog *log,float value)

{
  MessageBuilder *this;
  MessageBuilder local_1a0;
  float local_1c;
  TestLog *pTStack_18;
  float value_local;
  TestLog *log_local;
  
  if ((value != 1.0) || (NAN(value))) {
    local_1c = value;
    pTStack_18 = log;
    tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [91])
                      "Failure: comp + (1.0-comp) doesn\'t equal 1.0 for some component of tessellation coordinate"
                     );
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    log_local._7_1_ = false;
  }
  else {
    log_local._7_1_ = true;
  }
  return log_local._7_1_;
}

Assistant:

bool compareOneMinusTessCoord (tcu::TestLog& log, const float value)
{
	if (value != 1.0f)
	{
		log << tcu::TestLog::Message << "Failure: comp + (1.0-comp) doesn't equal 1.0 for some component of tessellation coordinate" << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}